

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::unit_from_string(string *unit_string,uint64_t match_flags)

{
  ulong in_RSI;
  precise_unit pVar1;
  uint64_t in_stack_00000eb8;
  string *in_stack_00000ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (in_RSI & 0xffffffefffffffff),in_stack_ffffffffffffffd8);
  pVar1 = unit_from_string_internal(in_stack_00000ec0,in_stack_00000eb8);
  std::__cxx11::string::~string(pVar1._8_8_);
  return pVar1;
}

Assistant:

precise_unit
    unit_from_string(std::string unit_string, std::uint64_t match_flags)
{
    // always allow the code replacements on first run
    match_flags &= (~skip_code_replacements);
    return unit_from_string_internal(std::move(unit_string), match_flags);
}